

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispLexer.cpp
# Opt level: O3

void __thiscall
Shell::LispLexer::readQuotedString
          (LispLexer *this,Token *token,char opening,char closing,char escapeChar)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  LexerException *pLVar5;
  int iVar6;
  string local_70;
  string local_50;
  
  bVar2 = Lexer::readNextChar(&this->super_Lexer);
  if (bVar2) {
    iVar6 = (int)escapeChar;
    bVar2 = false;
    do {
      iVar1 = (this->super_Lexer)._lastCharacter;
      if ((closing == escapeChar || bVar2) || iVar1 != iVar6) {
        if (iVar1 == closing) {
          if (bVar2 == false) {
            if (closing != escapeChar) {
LAB_006f024f:
              Lexer::saveTokenText(&this->super_Lexer,token);
              Lexer::readNextChar(&this->super_Lexer);
              token->tag = TT_NAME;
              return;
            }
            iVar4 = Lexer::lookAhead(&this->super_Lexer);
            if (iVar4 != closing) goto LAB_006f024f;
            Lexer::readNextChar(&this->super_Lexer);
            goto LAB_006f01e0;
          }
        }
        else if (bVar2 == true && iVar1 != iVar6) {
          pLVar5 = (LexerException *)__cxa_allocate_exception(0x48);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"invalid escape sequence in quoted string ","");
          LexerException::LexerException(pLVar5,&local_50,&this->super_Lexer);
          __cxa_throw(pLVar5,&LexerException::typeinfo,LexerException::~LexerException);
        }
        Lexer::saveLastChar(&this->super_Lexer);
      }
LAB_006f01e0:
      bVar2 = (bool)((closing == escapeChar | bVar2 | iVar1 != iVar6) ^ 1);
      bVar3 = Lexer::readNextChar(&this->super_Lexer);
    } while (bVar3);
  }
  pLVar5 = (LexerException *)__cxa_allocate_exception(0x48);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"file ended while reading quoted string ","");
  LexerException::LexerException(pLVar5,&local_70,&this->super_Lexer);
  __cxa_throw(pLVar5,&LexerException::typeinfo,LexerException::~LexerException);
}

Assistant:

void LispLexer::readQuotedString(Token& token, char opening, char closing, char escapeChar)
{
  bool escape=false;
  // Don't save this char so that the final string doesn't contain the quote symbol
  //saveLastChar();

  while (readNextChar()) {
    if (_lastCharacter == escapeChar && !escape && closing != escapeChar) {
      escape=true;
    }
    else if (_lastCharacter == closing && !escape) {
      if(closing == escapeChar && lookAhead() == closing){
        readNextChar();
      }
      else{
        // Don't save this char so that the final string doesn't contain the quote symbol
        //saveLastChar();
        saveTokenText(token);
        readNextChar();
        token.tag = TT_NAME;
        return;
      }
    }
    else {
      if (escape && _lastCharacter!=closing && _lastCharacter!=escapeChar) {
	throw LexerException((std::string)"invalid escape sequence in quoted string ", *this);
      }
      escape=false;
      saveLastChar();
    }
  }
  throw LexerException((std::string)"file ended while reading quoted string ", *this);
}